

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_>::
freeData(Span<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_> *this)

{
  Entry *pEVar1;
  int *piVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  
  if (this->entries != (Entry *)0x0) {
    lVar5 = 0;
    do {
      uVar4 = (ulong)this->offsets[lVar5];
      if (uVar4 != 0xff) {
        pEVar1 = this->entries;
        piVar2 = *(int **)(pEVar1[uVar4].storage.data + 0x28);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if ((*piVar2 == 0) &&
             (pvVar3 = *(void **)(pEVar1[uVar4].storage.data + 0x28), pvVar3 != (void *)0x0)) {
            operator_delete(pvVar3);
          }
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }